

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

errr finish_parse_monster(parser *p)

{
  uint16_t *puVar1;
  monster_race *pmVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  monster_blow *pmVar5;
  blow_method *pbVar6;
  blow_effect *pbVar7;
  long lVar8;
  long lVar9;
  undefined8 *p_00;
  monster_lore *pmVar10;
  wchar_t wVar11;
  long *plVar12;
  undefined8 *__src;
  monster_blow *pmVar13;
  angband_constants *paVar14;
  void *pvVar15;
  monster_race *pmVar16;
  uint16_t uVar17;
  monster_blow *pmVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ushort uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  size_t len;
  long *plVar26;
  monster_friends *pmVar27;
  monster_shape *pmVar28;
  
  paVar14 = z_info;
  z_info->r_max = 0;
  paVar14->mon_blows_max = 0;
  plVar12 = (long *)parser_priv(p);
  paVar14 = z_info;
  if (plVar12 == (long *)0x0) {
    uVar17 = z_info->r_max;
  }
  else {
    uVar17 = z_info->r_max;
    uVar25 = (uint)z_info->mon_blows_max;
    do {
      plVar26 = (long *)plVar12[0xf];
      if (plVar26 != (long *)0x0) {
        uVar24 = 0xffffffff;
        do {
          uVar23 = uVar24;
          plVar26 = (long *)*plVar26;
          uVar24 = uVar23 + 1;
        } while (plVar26 != (long *)0x0);
        if ((uVar25 & 0xffff) <= uVar24) {
          uVar25 = uVar23 + 2;
          paVar14->mon_blows_max = (uint16_t)uVar25;
        }
      }
      uVar17 = uVar17 + 1;
      plVar12 = (long *)*plVar12;
    } while (plVar12 != (long *)0x0);
    paVar14->r_max = uVar17;
  }
  r_info = (monster_race *)mem_zalloc((ulong)uVar17 * 0xd0 + 0xd0);
  uVar22 = z_info->r_max;
  __src = (undefined8 *)parser_priv(p);
  uVar21 = (ulong)uVar22;
  pmVar2 = r_info;
  do {
    r_info = pmVar2;
    if (__src == (undefined8 *)0x0) {
      puVar1 = &z_info->r_max;
      *puVar1 = *puVar1 + 1;
      if (*puVar1 == 0) {
        len = 0;
      }
      else {
        uVar21 = 0;
        do {
          pmVar2 = r_info + uVar21;
          for (pmVar27 = r_info[uVar21].friends; pmVar27 != (monster_friends *)0x0;
              pmVar27 = pmVar27->next) {
            wVar11 = my_stricmp(pmVar27->name,"same");
            pmVar16 = pmVar2;
            if (wVar11 != L'\0') {
              pmVar16 = lookup_monster(pmVar27->name);
            }
            pmVar27->race = pmVar16;
            if (pmVar16 == (monster_race *)0x0) {
              quit_fmt("Couldn\'t find friend named \'%s\' for monster \'%s\'",pmVar27->name,
                       pmVar2->name);
            }
            string_free(pmVar27->name);
          }
          for (pmVar28 = pmVar2->shapes; pmVar28 != (monster_shape *)0x0; pmVar28 = pmVar28->next) {
            if (pmVar28->base == (monster_base *)0x0) {
              pmVar16 = lookup_monster(pmVar28->name);
              pmVar28->race = pmVar16;
              if (pmVar16 == (monster_race *)0x0) {
                quit_fmt("Couldn\'t find shape named \'%s\' for monster \'%s\'",pmVar28->name,
                         pmVar2->name);
              }
            }
            string_free(pmVar28->name);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 < z_info->r_max);
        len = (ulong)z_info->r_max * 0x78;
      }
      l_list = (monster_lore *)mem_zalloc(len);
      if (z_info->r_max != 0) {
        lVar19 = 0x68;
        uVar21 = 0;
        do {
          pmVar10 = l_list;
          pvVar15 = mem_zalloc((ulong)z_info->mon_blows_max * 0x30);
          *(void **)(pmVar10->flags + lVar19 + -0x70) = pvVar15;
          pvVar15 = mem_zalloc((ulong)z_info->mon_blows_max);
          *(void **)(pmVar10->flags + lVar19 + -0x20) = pvVar15;
          uVar21 = uVar21 + 1;
          lVar19 = lVar19 + 0x78;
        } while (uVar21 < z_info->r_max);
      }
      parser_destroy(p);
      return 0;
    }
    if ((long)uVar21 < 1) {
      __assert_fail("ridx >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                    ,0x6ef,"errr finish_parse_monster(struct parser *)");
    }
    uVar20 = uVar21 - 1;
    memcpy(pmVar2 + uVar20,__src,0xd0);
    pmVar2[uVar20].ridx = (uint)uVar20;
    puVar3 = (undefined8 *)*__src;
    pmVar16 = pmVar2 + uVar21;
    if (z_info->r_max <= uVar21) {
      pmVar16 = (monster_race *)0x0;
    }
    pmVar2[uVar20].next = pmVar16;
    pmVar13 = (monster_blow *)mem_zalloc((ulong)z_info->mon_blows_max * 0x30);
    plVar12 = (long *)__src[0xf];
    if (plVar12 != (long *)0x0) {
      if (z_info->mon_blows_max != 0) {
        uVar21 = 0;
        pmVar18 = pmVar13;
        do {
          pmVar5 = (monster_blow *)*plVar12;
          pbVar6 = (blow_method *)plVar12[1];
          pbVar7 = (blow_effect *)plVar12[2];
          lVar19 = plVar12[3];
          lVar8 = plVar12[4];
          lVar9 = plVar12[5];
          (pmVar18->dice).sides = (int)lVar8;
          (pmVar18->dice).m_bonus = (int)((ulong)lVar8 >> 0x20);
          *(long *)&pmVar18->times_seen = lVar9;
          pmVar18->effect = pbVar7;
          (pmVar18->dice).base = (int)lVar19;
          (pmVar18->dice).dice = (int)((ulong)lVar19 >> 0x20);
          pmVar18->next = pmVar5;
          pmVar18->method = pbVar6;
          plVar12 = (long *)*plVar12;
          if (plVar12 == (long *)0x0) {
            uVar22 = z_info->mon_blows_max;
            break;
          }
          uVar21 = uVar21 + 1;
          uVar22 = z_info->mon_blows_max;
          pmVar18 = pmVar18 + 1;
        } while (uVar21 < uVar22);
        if (uVar22 != 0) {
          uVar21 = 0;
          paVar14 = z_info;
          pmVar18 = pmVar13;
          do {
            if (pmVar18->next != (monster_blow *)0x0) {
              pmVar18->next = pmVar18 + 1;
              paVar14 = z_info;
            }
            uVar21 = uVar21 + 1;
            pmVar18 = pmVar18 + 1;
          } while (uVar21 < paVar14->mon_blows_max);
        }
      }
      p_00 = (undefined8 *)__src[0xf];
      while (p_00 != (undefined8 *)0x0) {
        puVar4 = (undefined8 *)*p_00;
        mem_free(p_00);
        p_00 = puVar4;
      }
    }
    r_info[uVar20].blow = pmVar13;
    mem_free(__src);
    __src = puVar3;
    uVar21 = uVar20;
    pmVar2 = r_info;
  } while( true );
}

Assistant:

static errr finish_parse_monster(struct parser *p) {
	struct monster_race *r, *n;
	size_t i;
	int ridx;

	/* Scan the list for the max id and max blows */
	z_info->r_max = 0;
	z_info->mon_blows_max = 0;
	r = parser_priv(p);
	while (r) {
		int max_blows = 0;
		struct monster_blow *b = r->blow;
		z_info->r_max++;
		while (b) {
			b = b->next;
			max_blows++;
		}
		if (max_blows > z_info->mon_blows_max)
			z_info->mon_blows_max = max_blows;
		r = r->next;
	}

	/* Allocate the direct access list and copy the race records to it */
	r_info = mem_zalloc((z_info->r_max + 1) * sizeof(*r));
	ridx = z_info->r_max - 1;
	for (r = parser_priv(p); r; r = n, ridx--) {
		struct monster_blow *b_new;

		assert(ridx >= 0);

		/* Main record */
		memcpy(&r_info[ridx], r, sizeof(*r));
		r_info[ridx].ridx = ridx;
		n = r->next;
		if (ridx < z_info->r_max - 1)
			r_info[ridx].next = &r_info[ridx + 1];
		else
			r_info[ridx].next = NULL;

		/* Blows */
		b_new = mem_zalloc(z_info->mon_blows_max * sizeof(*b_new));
		if (r->blow) {
			struct monster_blow *b_temp, *b_old = r->blow;

			/* Allocate space and copy */
			for (i = 0; i < z_info->mon_blows_max; i++) {
				memcpy(&b_new[i], b_old, sizeof(*b_old));
				b_old = b_old->next;
				if (!b_old) break;
			}

			/* Make next point correctly */
			for (i = 0; i < z_info->mon_blows_max; i++)
				if (b_new[i].next)
					b_new[i].next = &b_new[i + 1];

			/* Tidy up */
			b_old = r->blow;
			b_temp = b_old;
			while (b_temp) {
				b_temp = b_old->next;
				mem_free(b_old);
				b_old = b_temp;
			}
		}
		r_info[ridx].blow = b_new;

		mem_free(r);
	}
	z_info->r_max += 1;

	/* Convert friend and shape names into race pointers */
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		struct monster_friends *f;
		struct monster_shape *s;
		for (f = race->friends; f; f = f->next) {
			if (!my_stricmp(f->name, "same")) {
				f->race = race;
			} else {
				f->race = lookup_monster(f->name);
			}
			if (!f->race) {
				quit_fmt("Couldn't find friend named '%s' for monster '%s'",
						 f->name, race->name);
			}
			string_free(f->name);
		}
		for (s = race->shapes; s; s = s->next) {
			if (!s->base) {
				s->race = lookup_monster(s->name);
				if (!s->race) {
					quit_fmt("Couldn't find shape named '%s' for monster '%s'",
							 s->name, race->name);
				}
			}
			string_free(s->name);
		}
	}

	/* Allocate space for the monster lore */
	l_list = mem_zalloc(z_info->r_max * sizeof(struct monster_lore));
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_lore *l = &l_list[i];
		l->blows = mem_zalloc(z_info->mon_blows_max * sizeof(struct monster_blow));
		l->blow_known = mem_zalloc(z_info->mon_blows_max * sizeof(bool));
	}

	parser_destroy(p);
	return 0;
}